

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O0

uint32_t __thiscall
ans_fold_decode<1U>::decode_sym(ans_fold_decode<1U> *this,uint64_t *state,uint8_t **in_u8)

{
  uint32_t uVar1;
  reference pvVar2;
  uint8_t **in_RDX;
  dec_entry_fold *in_RSI;
  long in_RDI;
  uint32_t decoded_sym;
  uint32_t *in_ptr_u32;
  value_type *entry;
  
  pvVar2 = std::vector<dec_entry_fold,_std::allocator<dec_entry_fold>_>::operator[]
                     ((vector<dec_entry_fold,_std::allocator<dec_entry_fold>_> *)(in_RDI + 0x38),
                      (ulong)*in_RSI & *(ulong *)(in_RDI + 0x20));
  *in_RSI = (dec_entry_fold)
            ((ulong)pvVar2->freq * ((ulong)*in_RSI >> ((byte)*(undefined8 *)(in_RDI + 0x28) & 0x3f))
            + (ulong)pvVar2->offset);
  if ((ulong)*in_RSI < (ulong)*(dec_entry_fold *)(in_RDI + 0x30)) {
    *in_RDX = *in_RDX + -4;
    *in_RSI = (dec_entry_fold)((long)*in_RSI << 0x20 | (ulong)*(uint *)*in_RDX);
  }
  uVar1 = ans_fold_undo_mapping(in_RSI,in_RDX);
  return uVar1;
}

Assistant:

uint32_t decode_sym(uint64_t& state, const uint8_t*& in_u8)
    {
        const auto& entry = table[state & frame_mask];
        state = uint64_t(entry.freq) * (state >> frame_log2)
            + uint64_t(entry.offset);
        if (state < lower_bound) {
            in_u8 -= sizeof(uint32_t);
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
            state = state << constants::RADIX_LOG2 | uint64_t(*in_ptr_u32);
        }
        auto decoded_sym = ans_fold_undo_mapping(entry, in_u8);
        return decoded_sym;
    }